

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O3

void __thiscall
polyscope::SurfaceFaceVectorQuantity::SurfaceFaceVectorQuantity
          (SurfaceFaceVectorQuantity *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vectors_,SurfaceMesh *mesh_,VectorType vectorType_)

{
  pointer pcVar1;
  SurfaceMesh *pSVar2;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  pSVar2 = mesh_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  SurfaceVectorQuantity::SurfaceVectorQuantity
            (&this->super_SurfaceVectorQuantity,&local_50,mesh_,(MeshElement)pSVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_SurfaceVectorQuantity = &PTR__SurfaceFaceVectorQuantity_005f4478;
  VectorQuantity<polyscope::SurfaceFaceVectorQuantity>::VectorQuantity
            (&this->super_VectorQuantity<polyscope::SurfaceFaceVectorQuantity>,this,vectors_,
             (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             (*(long *)&(this->super_SurfaceVectorQuantity).field_0x190 + 0xd68),vectorType_);
  *(undefined ***)&this->super_SurfaceVectorQuantity = &PTR__SurfaceFaceVectorQuantity_005f4478;
  return;
}

Assistant:

SurfaceFaceVectorQuantity::SurfaceFaceVectorQuantity(std::string name, std::vector<glm::vec3> vectors_,
                                                     SurfaceMesh& mesh_, VectorType vectorType_)
    : SurfaceVectorQuantity(name, mesh_, MeshElement::FACE),
      VectorQuantity<SurfaceFaceVectorQuantity>(*this, vectors_, parent.faceCenters, vectorType_) {}